

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

void parse_bios_version(uint16_t offset)

{
  ushort in_DI;
  
  major_version = bios->data[(int)(in_DI + 3)];
  chip_version = bios->data[(int)(in_DI + 2)];
  if (card_codename == 0) {
    card_codename = (uint32_t)chip_version;
  }
  minor_version = bios->data[(int)(in_DI + 1)];
  micro_version = bios->data[(int)(uint)in_DI];
  if ((major_version < 3) || (major_version == 0x14)) {
    chipset_family = '\x04';
  }
  else if (major_version < 5) {
    chipset_family = (byte)card_codename & 0xf0;
  }
  else if (major_version < 0x60) {
    chipset_family = '@';
  }
  else if (major_version < 0x70) {
    chipset_family = 'P';
  }
  else if (major_version < 0x75) {
    if ((card_codename < 0x11) || (0x1f < card_codename)) {
      chipset_family = 0xc0;
    }
    else {
      chipset_family = 'P';
    }
  }
  else if (major_version == 0x75) {
    chipset_family = 0xd0;
  }
  printf("Bios version %02x.%02x.%02x.%02x\n\n",(ulong)bios->data[(int)(in_DI + 3)],
         (ulong)bios->data[(int)(in_DI + 2)],(ulong)bios->data[(int)(in_DI + 1)],
         (ulong)bios->data[in_DI]);
  printf("Card codename %02x\n",(ulong)card_codename);
  printf("Card chipset family %02x\n\n",(ulong)chipset_family);
  return;
}

Assistant:

static void parse_bios_version(uint16_t offset)
{
	/*
	 * offset + 0  (8 bits): Micro version
	 * offset + 1  (8 bits): Minor version
	 * offset + 2  (8 bits): Chip version
	 * offset + 3  (8 bits): Major version
	 */

	major_version = bios->data[offset + 3];
	chip_version = bios->data[offset + 2];
	if(card_codename <= 0)
		card_codename = chip_version;
	minor_version = bios->data[offset + 1];
	micro_version = bios->data[offset + 0];

	if (major_version <= 0x2 || major_version == 0x14)
		chipset_family = 0x04;
	else if (major_version < 0x5)
		chipset_family = card_codename & 0xf0;
	else if (major_version < 0x60)
		chipset_family = 0x40;
	else if (major_version < 0x70)
		chipset_family = 0x50;
	else if (major_version < 0x75)
		if (card_codename > 0x10 && card_codename < 0x20)
			chipset_family = 0x50;
		else
			chipset_family = 0xc0;
	else if (major_version == 0x75)
		chipset_family = 0xd0;

	printf("Bios version %02x.%02x.%02x.%02x\n\n",
		 bios->data[offset + 3], bios->data[offset + 2],
		 bios->data[offset + 1], bios->data[offset]);
	printf("Card codename %02x\n",
		 card_codename);
	printf("Card chipset family %02x\n\n",
		 chipset_family);
}